

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_138::GlobalRefining::run(GlobalRefining *this,Module *module)

{
  Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_> *this_00;
  pointer puVar1;
  Function *__args;
  _Base_ptr p_Var2;
  long lVar3;
  value_type *__v;
  pointer puVar4;
  Global *pGVar5;
  Type left;
  Type right;
  pointer ppEVar6;
  pointer puVar7;
  DataSegment *pDVar8;
  _func_int **pp_Var9;
  Module *pMVar10;
  undefined8 uVar11;
  bool bVar12;
  mapped_type *__args_1;
  mapped_type *pmVar13;
  _Rb_tree_node_base *p_Var14;
  size_type sVar15;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar16;
  _Base_ptr p_Var17;
  undefined1 auVar18 [8];
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var22;
  pointer ppEVar23;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  undefined1 local_350 [8];
  unordered_map<wasm::Name,_wasm::LUBFinder,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>_>
  lubs;
  undefined1 local_260 [8];
  GetUpdater updater;
  undefined1 local_100 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  unoptimizable;
  _Any_data local_a0 [2];
  Module *local_80;
  ParallelFunctionAnalysis<GlobalInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  
  if (((module->features).features & 0x400) != 0) {
    unoptimizable._M_h._M_single_bucket = (__node_base_ptr)0x0;
    analysis._24_8_ = &analysis.field_0x8;
    analysis._8_4_ = 0;
    analysis._16_8_ = 0;
    analysis._40_8_ = 0;
    puVar1 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = module;
    analysis._32_8_ = analysis._24_8_;
    analysis._48_8_ = this;
    for (puVar16 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar1;
        puVar16 = puVar16 + 1) {
      local_260 = (undefined1  [8])
                  (puVar16->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      std::
      map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
      ::operator[]((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                    *)&analysis,(key_type *)local_260);
    }
    std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
              ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)local_a0,
               (function<void_(wasm::Function_*,_GlobalInfo_&)> *)
               &unoptimizable._M_h._M_single_bucket);
    puVar1 = (local_80->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (local_80->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar1;
        puVar16 = puVar16 + 1) {
      __args = (puVar16->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(__args->super_Importable).module + 8) != (char *)0x0) {
        local_260 = (undefined1  [8])__args;
        __args_1 = std::
                   map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                   ::operator[]((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
                                 *)&analysis,(key_type *)local_260);
        std::function<void_(wasm::Function_*,_GlobalInfo_&)>::operator()
                  ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)local_a0,__args,__args_1);
      }
    }
    PassRunner::PassRunner((PassRunner *)local_350,local_80);
    pMVar10 = local_80;
    std::function<void_(wasm::Function_*,_GlobalInfo_&)>::function
              ((function<void_(wasm::Function_*,_GlobalInfo_&)> *)local_100,
               (function<void_(wasm::Function_*,_GlobalInfo_&)> *)local_a0);
    wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::GlobalRefining::
    run(wasm::Module*)::GlobalInfo,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::
    doAnalysis(std::function<void(wasm::Function*,wasm::(anonymous_namespace)::GlobalRefining::
    run(wasm::Module*)::GlobalInfo&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
    (anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo,std::less<wasm::
    Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
    GlobalRefining::run(wasm::Module*)::GlobalInfo>>>&,std::function<void(wasm::Function*,wasm::
    (anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GlobalInfo__>_
              (local_260,pMVar10,(Map *)&analysis,(Func *)local_100);
    pMVar10 = local_80;
    Pass::setPassRunner((Pass *)local_260,(PassRunner *)local_350);
    (**(code **)&(((Importable *)local_260)->super_Named).hasExplicitName)
              ((Pass *)local_260,pMVar10);
    ::anon_func::Mapper::~Mapper((Mapper *)local_260);
    std::_Function_base::~_Function_base((_Function_base *)local_100);
    PassRunner::~PassRunner((PassRunner *)local_350);
    std::_Function_base::~_Function_base((_Function_base *)local_a0);
    std::_Function_base::~_Function_base((_Function_base *)&unoptimizable._M_h._M_single_bucket);
    local_350 = (undefined1  [8])&lubs._M_h._M_rehash_policy._M_next_resize;
    lubs._M_h._M_buckets = (__buckets_ptr)0x1;
    lubs._M_h._M_bucket_count = 0;
    lubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    lubs._M_h._M_element_count._0_4_ = 0x3f800000;
    lubs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    lubs._M_h._M_rehash_policy._4_4_ = 0;
    lubs._M_h._M_rehash_policy._M_next_resize = 0;
    for (p_Var14 = (_Rb_tree_node_base *)analysis._24_8_;
        p_Var14 != (_Rb_tree_node_base *)&analysis.field_0x8;
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      p_Var2 = p_Var14[1]._M_left;
      for (p_Var17 = p_Var14[1]._M_parent; p_Var17 != p_Var2;
          p_Var17 = (_Base_ptr)&p_Var17->_M_parent) {
        lVar3 = *(long *)p_Var17;
        pmVar13 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_350,(key_type *)(lVar3 + 0x10));
        LUBFinder::note(pmVar13,(Type)*(uintptr_t *)(*(long *)(lVar3 + 0x20) + 8));
      }
    }
    local_100 = (undefined1  [8])&unoptimizable._M_h._M_rehash_policy._M_next_resize;
    unoptimizable._M_h._M_buckets = (__buckets_ptr)0x1;
    unoptimizable._M_h._M_bucket_count = 0;
    unoptimizable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    unoptimizable._M_h._M_element_count._0_4_ = 0x3f800000;
    unoptimizable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    unoptimizable._M_h._M_rehash_policy._4_4_ = 0;
    unoptimizable._M_h._M_rehash_policy._M_next_resize = 0;
    ExportUtils::getExportedGlobals
              ((vector<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)local_260,module);
    pp_Var9 = updater.
              super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
              super_Pass._vptr_Pass;
    for (auVar18 = local_260; auVar18 != (undefined1  [8])pp_Var9;
        auVar18 = (undefined1  [8])
                  &(((Function *)auVar18)->super_Importable).super_Named.name.super_IString.str.
                   _M_str) {
      __v = (value_type *)
            (((Function *)auVar18)->super_Importable).super_Named.name.super_IString.str._M_len;
      if ((*(char *)(*(long *)(analysis._48_8_ + 8) + 0x55) != '\0') ||
         (*(char *)&__v[4].super_IString.str._M_str == '\x01')) {
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_100,__v);
      }
    }
    std::_Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>::~_Vector_base
              ((_Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_> *)local_260);
    puVar4 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar12 = false;
    for (puVar19 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; uVar11 = analysis._48_8_,
        puVar19 != puVar4; puVar19 = puVar19 + 1) {
      pGVar5 = (puVar19->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar5->super_Importable).module + 8) == (char *)0x0) {
        sVar15 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_100,(key_type *)pGVar5);
        if (sVar15 == 0) {
          pmVar13 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_350,
                                 (key_type *)
                                 (puVar19->_M_t).
                                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                 .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
          LUBFinder::note(pmVar13,(Type)(((puVar19->_M_t).
                                          super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl
                                         )->init->type).id);
          left.id = (pmVar13->lub).id;
          if ((left.id != 1) &&
             (right.id = (((puVar19->_M_t).
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->type).id,
             left.id != right.id)) {
            bVar12 = wasm::Type::isSubType(left,right);
            if (!bVar12) {
              __assert_fail("Type::isSubType(newType, oldType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalRefining.cpp"
                            ,0x6b,
                            "virtual void wasm::(anonymous namespace)::GlobalRefining::run(Module *)"
                           );
            }
            (((puVar19->_M_t).
              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
              super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->type).id = left.id;
            bVar12 = true;
          }
        }
      }
    }
    if (bVar12) {
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass.runner =
           (PassRunner *)
           &updater.
            super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
            super_Pass.name._M_string_length;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass._vptr_Pass = (_func_int **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass.name._M_dataplus._M_p = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass.name._M_string_length._0_1_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._33_7_ = 0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.replacep = (Expression **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.fixed._M_elems[9].currp =
           (Expression **)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_260 = (undefined1  [8])&PTR__WalkerPass_011211b8;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currModule =
           (Module *)analysis._48_8_;
      updater.wasm._0_1_ = 0;
      updater.parent = (GlobalRefining *)module;
      Pass::setPassRunner((Pass *)local_260,*(PassRunner **)(analysis._48_8_ + 8));
      (**(code **)&(((Importable *)local_260)->super_Named).hasExplicitName)
                ((Pass *)local_260,module);
      this_00 = (Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_> *)
                ((long)&updater.
                        super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                        .super_Pass.passArg.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                + 0x20);
      Pass::setPassRunner((Pass *)local_260,*(PassRunner **)(uVar11 + 8));
      puVar4 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)module;
      for (puVar19 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar4;
          puVar19 = puVar19 + 1) {
        pGVar5 = (puVar19->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar5->super_Importable).module + 8) == (char *)0x0) {
          Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk(this_00,&pGVar5->init);
        }
      }
      analysis._48_8_ =
           (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar20 = (module->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar20 != (pointer)analysis._48_8_;
          puVar20 = puVar20 + 1) {
        _Var22._M_head_impl =
             *(ElementSegment **)
              &(puVar20->_M_t).
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               ._M_t;
        if (*(long *)((long)_Var22._M_head_impl + 0x28) != 0) {
          Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                    (this_00,(Expression **)((long)_Var22._M_head_impl + 0x28));
          _Var22._M_head_impl =
               *(ElementSegment **)
                &(puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t;
        }
        ppEVar6 = *(pointer *)((long)&(_Var22._M_head_impl)->data + 8);
        for (ppEVar23 = *(pointer *)
                         &((_Var22._M_head_impl)->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ; ppEVar23 != ppEVar6; ppEVar23 = ppEVar23 + 1) {
          local_a0[0]._0_8_ = *ppEVar23;
          Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk
                    (this_00,(Expression **)local_a0);
        }
      }
      puVar7 = (module->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar21 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar7;
          puVar21 = puVar21 + 1) {
        pDVar8 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar8->offset != (Expression *)0x0) {
          Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::walk(this_00,&pDVar8->offset);
        }
      }
      updater.super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>.
      super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
      super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)0x0;
      WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>::~WalkerPass
                ((WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_> *)
                 local_260);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_100);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::LUBFinder>,_std::allocator<std::pair<const_wasm::Name,_wasm::LUBFinder>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_350);
    std::
    map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
    ::~map((map<wasm::Function_*,_GlobalInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_GlobalInfo>_>_>
            *)&analysis);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the global.sets.

    struct GlobalInfo {
      std::vector<GlobalSet*> sets;
    };

    ModuleUtils::ParallelFunctionAnalysis<GlobalInfo> analysis(
      *module, [&](Function* func, GlobalInfo& info) {
        if (func->imported()) {
          return;
        }
        info.sets = std::move(FindAll<GlobalSet>(func->body).list);
      });

    // A map of globals to the lub for that global.
    std::unordered_map<Name, LUBFinder> lubs;

    // Combine all the information we gathered and compute lubs.
    for (auto& [func, info] : analysis.map) {
      for (auto* set : info.sets) {
        lubs[set->name].note(set->value->type);
      }
    }

    // In closed world we cannot change the types of exports, as we might change
    // from a public type to a private that would cause a validation error.
    // TODO We could refine to a type that is still public, however.
    //
    // We are also limited in open world: in that mode we must assume that
    // another module might import our exported globals with the current type
    // (that type is a contract between them), and in such a case the type of
    // mutable globals must match precisely (the same rule as for mutable struct
    // fields in subtypes - the types must match exactly, or else a write in
    // one place could store a type considered in valid in another place).
    std::unordered_set<Name> unoptimizable;
    for (auto* global : ExportUtils::getExportedGlobals(*module)) {
      if (getPassOptions().closedWorld || global->mutable_) {
        unoptimizable.insert(global->name);
      }
    }

    bool optimized = false;

    for (auto& global : module->globals) {
      if (global->imported() || unoptimizable.count(global->name)) {
        continue;
      }

      auto& lub = lubs[global->name];

      // Note the initial value.
      lub.note(global->init->type);

      // The initial value cannot be unreachable, but it might be null, and all
      // other values might be too. In that case, we've noted nothing useful
      // and we can move on.
      if (!lub.noted()) {
        continue;
      }

      auto oldType = global->type;
      auto newType = lub.getLUB();
      if (newType != oldType) {
        // We found an improvement!
        assert(Type::isSubType(newType, oldType));
        global->type = newType;
        optimized = true;
      }
    }

    if (!optimized) {
      return;
    }

    // Update function contents for their new parameter types: global.gets must
    // now return the new type for any globals that we modified.
    struct GetUpdater : public WalkerPass<PostWalker<GetUpdater>> {
      bool isFunctionParallel() override { return true; }

      // Only modifies global.get operations.
      bool requiresNonNullableLocalFixups() override { return false; }

      GlobalRefining& parent;
      Module& wasm;

      GetUpdater(GlobalRefining& parent, Module& wasm)
        : parent(parent), wasm(wasm) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<GetUpdater>(parent, wasm);
      }

      // If we modify anything in a function then we must refinalize so that
      // types propagate outwards.
      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        auto oldType = curr->type;
        auto newType = wasm.getGlobal(curr->name)->type;
        if (newType != oldType) {
          curr->type = newType;
          modified = true;
        }
      }

      void visitFunction(Function* curr) {
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, &wasm);
        }
      }
    } updater(*this, *module);
    updater.run(getPassRunner(), module);
    updater.runOnModuleCode(getPassRunner(), module);
  }